

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharSet.cpp
# Opt level: O3

void __thiscall
UnifiedRegex::RuntimeCharSet<char16_t>::CloneFrom
          (RuntimeCharSet<char16_t> *this,ArenaAllocator *allocator,CharSet<char16_t> *other)

{
  uint32 *puVar1;
  code *pcVar2;
  bool bVar3;
  uint n;
  int iVar4;
  uint uVar5;
  undefined4 *puVar6;
  CharSetInner *this_00;
  undefined4 extraout_var;
  CharSetNode *pCVar7;
  long lVar8;
  uint i;
  uint index;
  undefined4 extraout_var_00;
  
  if (this->root != (CharSetNode *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6e9,"(root == nullptr)","root == nullptr");
    if (!bVar3) goto LAB_00e5df12;
    *puVar6 = 0;
  }
  iVar4 = 0;
  lVar8 = 2;
  do {
    iVar4 = iVar4 + POPCOUNT((this->direct).vec[lVar8 + -2]);
    lVar8 = lVar8 + 1;
  } while (lVar8 != 10);
  if (iVar4 != 0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                       ,0x6ea,"(direct.Count() == 0)","direct.Count() == 0");
    if (!bVar3) {
LAB_00e5df12:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pCVar7 = (other->rep).full.root;
  if ((undefined1 *)0x4 < (undefined1 *)((long)&pCVar7[-1]._vptr_CharSetNode + 7U)) {
    if (pCVar7 == (CharSetNode *)0x0) {
      pCVar7 = (CharSetNode *)0x0;
    }
    else {
      iVar4 = (*pCVar7->_vptr_CharSetNode[1])(pCVar7,allocator);
      pCVar7 = (CharSetNode *)CONCAT44(extraout_var_00,iVar4);
    }
    this->root = pCVar7;
    lVar8 = 0;
    do {
      (this->direct).vec[lVar8] = *(uint32 *)((long)&other->rep + lVar8 * 4 + 8);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 8);
    return;
  }
  index = 0;
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    if ((undefined1 *)0x4 < (undefined1 *)((long)&pCVar7[-1]._vptr_CharSetNode + 7U)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.h"
                         ,0x1ef,"(IsCompact())","IsCompact()");
      if (!bVar3) goto LAB_00e5df12;
      *puVar6 = 0;
      pCVar7 = (CharSetNode *)(other->rep).compact.countPlusOne;
    }
    if ((int)pCVar7 - 1U <= index) {
      return;
    }
    uVar5 = CharSet<char16_t>::GetCompactCharU(other,index);
    if (uVar5 < 0x100) {
      puVar1 = (this->direct).vec + (uVar5 >> 5);
      *puVar1 = *puVar1 | 1 << ((byte)uVar5 & 0x1f);
    }
    else {
      this_00 = (CharSetInner *)this->root;
      if (this_00 == (CharSetInner *)0x0) {
        this_00 = (CharSetInner *)new<Memory::ArenaAllocator>(0x88,allocator,0x364470);
        CharSetInner::CharSetInner(this_00);
        this->root = (CharSetNode *)this_00;
      }
      iVar4 = (*(this_00->super_CharSetNode)._vptr_CharSetNode[2])
                        (this_00,allocator,2,(ulong)uVar5,(ulong)uVar5);
      if ((CharSetNode *)CONCAT44(extraout_var,iVar4) != this->root) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar6 = 1;
        bVar3 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharSet.cpp"
                           ,0x6fd,"(newRoot == root)","newRoot == root");
        if (!bVar3) goto LAB_00e5df12;
        *puVar6 = 0;
      }
    }
    index = index + 1;
    pCVar7 = (CharSetNode *)(other->rep).compact.countPlusOne;
  } while( true );
}

Assistant:

void RuntimeCharSet<char16>::CloneFrom(ArenaAllocator* allocator, const CharSet<Char>& other)
    {
        Assert(root == nullptr);
        Assert(direct.Count() == 0);
        if (other.IsCompact())
        {
            for (uint i = 0; i < other.GetCompactLength(); i++)
            {
                uint k = other.GetCompactCharU(i);
                if (k < CharSetNode::directSize)
                    direct.Set(k);
                else
                {
                    if (root == nullptr)
                        root = Anew(allocator, CharSetInner);
#if DBG
                    CharSetNode* newRoot =
#endif
                    root->Set(allocator, CharSetNode::levels - 1, k, k);
#if DBG
                    // NOTE: Since we can add at most MaxCompact characters, we can never fill a leaf or inner node,
                    //       thus we will never need to reallocated nodes
                    Assert(newRoot == root);
#endif
                }
            }
        }
        else
        {
            root = other.rep.full.root == nullptr ? nullptr : other.rep.full.root->Clone(allocator);
            direct.CloneFrom(other.rep.full.direct);
        }
    }